

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-vfp-uncond.inc.c
# Opt level: O2

_Bool disas_vfp_uncond(DisasContext_conflict1 *ctx,uint32_t insn)

{
  arg_disas_vfp_uncond0 *a;
  uint uVar1;
  _Bool _Var2;
  uint uVar3;
  uint32_t in_EDX;
  code *pcVar4;
  anon_union_20_4_fa272343 u;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  a = (arg_disas_vfp_uncond0 *)(ulong)insn;
  uVar3 = insn & 0xff800f50;
  uVar1 = insn >> 0x10;
  if (uVar3 == 0xfe800b40) {
    if ((insn >> 0x14 & 3) != 3) {
      if ((insn >> 0x14 & 3) != 0) {
        return false;
      }
      disas_vfp_uncond_extract_vfp_dnm_d
                ((DisasContext_conflict1 *)&stack0xffffffffffffffdc,a,in_EDX);
      if ((ctx->isar->mvfr2 & 0xc0) == 0) {
        return false;
      }
      pcVar4 = gen_helper_vfp_minnumd;
LAB_005dc8d8:
      _Var2 = do_vfp_3op_dp(ctx,pcVar4,local_24,local_1c,local_20,false);
      return _Var2;
    }
    uVar3 = insn >> 0x12 & 3;
    if (uVar3 == 3) {
      local_14 = insn >> 1 & 0x10 | insn & 0xf;
      local_18 = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
      local_24 = 1;
LAB_005dca3a:
      local_1c = uVar1 & 3;
      local_20 = insn >> 7 & 1;
      _Var2 = trans_VCVT(ctx,(arg_VCVT *)&stack0xffffffffffffffdc);
      return _Var2;
    }
    if (uVar3 != 2) {
      return false;
    }
    local_18 = insn >> 1 & 0x10 | insn & 0xf;
    local_1c = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
    local_24 = 1;
LAB_005dc98f:
    local_20 = uVar1 & 3;
    if ((char)insn < '\0') {
      return false;
    }
    _Var2 = trans_VRINT(ctx,(arg_VRINT *)&stack0xffffffffffffffdc);
    return _Var2;
  }
  if (uVar3 != 0xfe000b00) {
    if (uVar3 == 0xfe800a00) {
      disas_vfp_uncond_extract_vfp_dnm_s
                ((DisasContext_conflict1 *)&stack0xffffffffffffffdc,a,in_EDX);
      if ((insn & 0x300000) != 0) {
        return false;
      }
      if ((ctx->isar->mvfr2 & 0xc0) == 0) {
        return false;
      }
      pcVar4 = gen_helper_vfp_maxnums;
    }
    else {
      if (uVar3 != 0xfe800a40) {
        if (uVar3 == 0xfe800b00) {
          disas_vfp_uncond_extract_vfp_dnm_d
                    ((DisasContext_conflict1 *)&stack0xffffffffffffffdc,a,in_EDX);
          if ((insn & 0x300000) != 0) {
            return false;
          }
          if ((ctx->isar->mvfr2 & 0xc0) == 0) {
            return false;
          }
          pcVar4 = gen_helper_vfp_maxnumd;
          goto LAB_005dc8d8;
        }
        if (uVar3 != 0xfe000a00) {
          return false;
        }
        local_18 = (insn >> 5 & 1) + (insn & 0xf) * 2;
        local_14 = insn >> 0xf & 0x1e | insn >> 7 & 1;
        local_1c = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
        local_20 = 0;
        goto LAB_005dc884;
      }
      if ((insn >> 0x14 & 3) == 3) {
        uVar3 = insn >> 0x12 & 3;
        if (uVar3 == 3) {
          local_14 = (insn >> 5 & 1) + (insn & 0xf) * 2;
          local_18 = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
          local_24 = 0;
          goto LAB_005dca3a;
        }
        if (uVar3 != 2) {
          return false;
        }
        local_18 = (insn >> 5 & 1) + (insn & 0xf) * 2;
        local_1c = insn >> 0xb & 0x1e | insn >> 0x16 & 1;
        local_24 = 0;
        goto LAB_005dc98f;
      }
      if ((insn >> 0x14 & 3) != 0) {
        return false;
      }
      disas_vfp_uncond_extract_vfp_dnm_s
                ((DisasContext_conflict1 *)&stack0xffffffffffffffdc,a,in_EDX);
      if ((ctx->isar->mvfr2 & 0xc0) == 0) {
        return false;
      }
      pcVar4 = gen_helper_vfp_minnums;
    }
    _Var2 = do_vfp_3op_sp(ctx,pcVar4,local_24,local_1c,local_20,false);
    return _Var2;
  }
  local_18 = insn >> 1 & 0x10 | insn & 0xf;
  local_14 = insn >> 3 & 0x10 | uVar1 & 0xf;
  local_1c = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
  local_20 = 1;
LAB_005dc884:
  local_24 = insn >> 0x14 & 3;
  _Var2 = trans_VSEL(ctx,(arg_VSEL *)&stack0xffffffffffffffdc);
  return _Var2;
}

Assistant:

static bool disas_vfp_uncond(DisasContext *ctx, uint32_t insn)
{
    union {
        arg_disas_vfp_uncond0 f_disas_vfp_uncond0;
        arg_disas_vfp_uncond1 f_disas_vfp_uncond1;
        arg_disas_vfp_uncond2 f_disas_vfp_uncond2;
        arg_disas_vfp_uncond3 f_disas_vfp_uncond3;
    } u;

    switch (insn & 0xff800f50) {
    case 0xfe000a00:
        /* 11111110 0....... ....1010 .0.0.... */
        /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:47 */
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_2(ctx, &u.f_disas_vfp_uncond1, insn);
        if (trans_VSEL(ctx, &u.f_disas_vfp_uncond1)) return true;
        return false;
    case 0xfe000b00:
        /* 11111110 0....... ....1011 .0.0.... */
        /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:49 */
        disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_3(ctx, &u.f_disas_vfp_uncond1, insn);
        if (trans_VSEL(ctx, &u.f_disas_vfp_uncond1)) return true;
        return false;
    case 0xfe800a00:
        /* 11111110 1....... ....1010 .0.0.... */
        disas_vfp_uncond_extract_vfp_dnm_s(ctx, &u.f_disas_vfp_uncond0, insn);
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1010 .0.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:52 */
            if (trans_VMAXNM_sp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        }
        return false;
    case 0xfe800a40:
        /* 11111110 1....... ....1010 .1.0.... */
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1010 .1.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:53 */
            disas_vfp_uncond_extract_vfp_dnm_s(ctx, &u.f_disas_vfp_uncond0, insn);
            if (trans_VMINNM_sp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        case 0x3:
            /* 11111110 1.11.... ....1010 .1.0.... */
            switch ((insn >> 18) & 0x3) {
            case 0x2:
                /* 11111110 1.1110.. ....1010 .1.0.... */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_4(ctx, &u.f_disas_vfp_uncond2, insn);
                switch ((insn >> 7) & 0x1) {
                case 0x0:
                    /* 11111110 1.1110.. ....1010 01.0.... */
                    /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:58 */
                    if (trans_VRINT(ctx, &u.f_disas_vfp_uncond2)) return true;
                    return false;
                }
                return false;
            case 0x3:
                /* 11111110 1.1111.. ....1010 .1.0.... */
                /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:64 */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_6(ctx, &u.f_disas_vfp_uncond3, insn);
                if (trans_VCVT(ctx, &u.f_disas_vfp_uncond3)) return true;
                return false;
            }
            return false;
        }
        return false;
    case 0xfe800b00:
        /* 11111110 1....... ....1011 .0.0.... */
        disas_vfp_uncond_extract_vfp_dnm_d(ctx, &u.f_disas_vfp_uncond0, insn);
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1011 .0.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:55 */
            if (trans_VMAXNM_dp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        }
        return false;
    case 0xfe800b40:
        /* 11111110 1....... ....1011 .1.0.... */
        switch ((insn >> 20) & 0x3) {
        case 0x0:
            /* 11111110 1.00.... ....1011 .1.0.... */
            /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:56 */
            disas_vfp_uncond_extract_vfp_dnm_d(ctx, &u.f_disas_vfp_uncond0, insn);
            if (trans_VMINNM_dp(ctx, &u.f_disas_vfp_uncond0)) return true;
            return false;
        case 0x3:
            /* 11111110 1.11.... ....1011 .1.0.... */
            switch ((insn >> 18) & 0x3) {
            case 0x2:
                /* 11111110 1.1110.. ....1011 .1.0.... */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_5(ctx, &u.f_disas_vfp_uncond2, insn);
                switch ((insn >> 7) & 0x1) {
                case 0x0:
                    /* 11111110 1.1110.. ....1011 01.0.... */
                    /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:60 */
                    if (trans_VRINT(ctx, &u.f_disas_vfp_uncond2)) return true;
                    return false;
                }
                return false;
            case 0x3:
                /* 11111110 1.1111.. ....1011 .1.0.... */
                /* /mnt/c/Users/me/Documents/projects/unicorn2/tmp/tmp/qemu-5.0.0/target/arm/vfp-uncond.decode:66 */
                disas_vfp_uncond_extract_disas_vfp_uncond_Fmt_7(ctx, &u.f_disas_vfp_uncond3, insn);
                if (trans_VCVT(ctx, &u.f_disas_vfp_uncond3)) return true;
                return false;
            }
            return false;
        }
        return false;
    }
    return false;
}